

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan_state.cpp
# Opt level: O3

void __thiscall
duckdb::ScanFilterInfo::Initialize
          (ScanFilterInfo *this,ClientContext *context,TableFilterSet *filters,
          vector<duckdb::StorageIndex,_true> *column_ids)

{
  unsafe_vector<bool> *this_00;
  _Head_base<0UL,_duckdb::AdaptiveFilter_*,_false> __ptr;
  TableFilterSet *pTVar1;
  _Head_base<0UL,_duckdb::AdaptiveFilter_*,_false> this_01;
  type __args_3;
  _Rb_tree_node_base *p_Var2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  ulong uVar5;
  _Base_ptr p_Var6;
  
  (this->table_filters).ptr = filters;
  this_01._M_head_impl = (AdaptiveFilter *)operator_new(0xa8);
  AdaptiveFilter::AdaptiveFilter(this_01._M_head_impl,filters);
  __ptr._M_head_impl =
       (this->adaptive_filter).
       super_unique_ptr<duckdb::AdaptiveFilter,_std::default_delete<duckdb::AdaptiveFilter>_>._M_t.
       super___uniq_ptr_impl<duckdb::AdaptiveFilter,_std::default_delete<duckdb::AdaptiveFilter>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::AdaptiveFilter_*,_std::default_delete<duckdb::AdaptiveFilter>_>
       .super__Head_base<0UL,_duckdb::AdaptiveFilter_*,_false>._M_head_impl;
  (this->adaptive_filter).
  super_unique_ptr<duckdb::AdaptiveFilter,_std::default_delete<duckdb::AdaptiveFilter>_>._M_t.
  super___uniq_ptr_impl<duckdb::AdaptiveFilter,_std::default_delete<duckdb::AdaptiveFilter>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::AdaptiveFilter_*,_std::default_delete<duckdb::AdaptiveFilter>_>.
  super__Head_base<0UL,_duckdb::AdaptiveFilter_*,_false>._M_head_impl = this_01._M_head_impl;
  if (__ptr._M_head_impl != (AdaptiveFilter *)0x0) {
    ::std::default_delete<duckdb::AdaptiveFilter>::operator()
              ((default_delete<duckdb::AdaptiveFilter> *)&this->adaptive_filter,__ptr._M_head_impl);
  }
  ::std::vector<duckdb::ScanFilter,_std::allocator<duckdb::ScanFilter>_>::reserve
            (&(this->filter_list).
              super_vector<duckdb::ScanFilter,_std::allocator<duckdb::ScanFilter>_>,
             (filters->filters)._M_t._M_impl.super__Rb_tree_header._M_node_count);
  for (p_Var2 = (filters->filters)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(filters->filters)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var2)) {
    __args_3 = unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::
               operator*((unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                          *)&p_Var2[1]._M_parent);
    ::std::vector<duckdb::ScanFilter,std::allocator<duckdb::ScanFilter>>::
    emplace_back<duckdb::ClientContext&,unsigned_long_const&,duckdb::vector<duckdb::StorageIndex,true>const&,duckdb::TableFilter&>
              ((vector<duckdb::ScanFilter,std::allocator<duckdb::ScanFilter>> *)&this->filter_list,
               context,(unsigned_long *)(p_Var2 + 1),column_ids,__args_3);
  }
  this_00 = &this->column_has_filter;
  ::std::vector<bool,_std::allocator<bool>_>::reserve
            ((vector<bool,_std::allocator<bool>_> *)this_00,
             (long)(column_ids->
                   super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>).
                   super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(column_ids->
                   super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>).
                   super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 5);
  if ((column_ids->super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>).
      super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (column_ids->super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>).
      super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar5 = 0;
    do {
      optional_ptr<duckdb::TableFilterSet,_true>::CheckValid(&this->table_filters);
      pTVar1 = (this->table_filters).ptr;
      p_Var3 = (pTVar1->filters)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var6 = &(pTVar1->filters)._M_t._M_impl.super__Rb_tree_header._M_header;
      p_Var4 = p_Var6;
      if (p_Var3 != (_Base_ptr)0x0) {
        do {
          if (*(ulong *)(p_Var3 + 1) >= uVar5) {
            p_Var4 = p_Var3;
          }
          p_Var3 = (&p_Var3->_M_left)[*(ulong *)(p_Var3 + 1) < uVar5];
        } while (p_Var3 != (_Base_ptr)0x0);
        if ((p_Var4 != p_Var6) && (*(ulong *)(p_Var4 + 1) <= uVar5)) {
          p_Var6 = p_Var4;
        }
      }
      optional_ptr<duckdb::TableFilterSet,_true>::CheckValid(&this->table_filters);
      ::std::vector<bool,_std::allocator<bool>_>::push_back
                ((vector<bool,_std::allocator<bool>_> *)this_00,
                 (_Rb_tree_header *)p_Var6 !=
                 &(((this->table_filters).ptr)->filters)._M_t._M_impl.super__Rb_tree_header);
      uVar5 = uVar5 + 1;
    } while (uVar5 < (ulong)((long)(column_ids->
                                   super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                   ).
                                   super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(column_ids->
                                   super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                   ).
                                   super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  ::std::vector<bool,_std::allocator<bool>_>::operator=
            ((vector<bool,_std::allocator<bool>_> *)&this->base_column_has_filter,
             &this_00->super_vector<bool,_std::allocator<bool>_>);
  return;
}

Assistant:

void ScanFilterInfo::Initialize(ClientContext &context, TableFilterSet &filters,
                                const vector<StorageIndex> &column_ids) {
	D_ASSERT(!filters.filters.empty());
	table_filters = &filters;
	adaptive_filter = make_uniq<AdaptiveFilter>(filters);
	filter_list.reserve(filters.filters.size());
	for (auto &entry : filters.filters) {
		filter_list.emplace_back(context, entry.first, column_ids, *entry.second);
	}
	column_has_filter.reserve(column_ids.size());
	for (idx_t col_idx = 0; col_idx < column_ids.size(); col_idx++) {
		bool has_filter = table_filters->filters.find(col_idx) != table_filters->filters.end();
		column_has_filter.push_back(has_filter);
	}
	base_column_has_filter = column_has_filter;
}